

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O2

void delist_object(chunk_conflict *c,object *obj)

{
  ulong uVar1;
  
  uVar1 = (ulong)obj->oidx;
  if (uVar1 != 0) {
    if (c->objects[uVar1] != obj) {
      __assert_fail("c->objects[obj->oidx] == obj",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cave.c"
                    ,0x1e8,"void delist_object(struct chunk *, struct object *)");
    }
    if ((cave != c) || (player->cave->objects[uVar1] == (object *)0x0)) {
      c->objects[uVar1] = (object *)0x0;
      obj->oidx = 0;
      return;
    }
  }
  return;
}

Assistant:

void delist_object(struct chunk *c, struct object *obj)
{
	if (!obj->oidx) return;
	assert(c->objects[obj->oidx] == obj);

	/* Don't delist an actual object if it still has a listed known object */
	if ((c == cave) && player->cave->objects[obj->oidx]) return;

	c->objects[obj->oidx] = NULL;
	obj->oidx = 0;
}